

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetExplicit(void *arkode_mem)

{
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long *in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (ARKodeARKStepMem *)0x1124f04);
  if (local_4 == 0) {
    if (*in_stack_ffffffffffffffe0 == 0) {
      arkProcessError(in_stack_ffffffffffffffe8,-0x16,"ARKode::ARKStep","ARKStepSetExplicit",
                      "Cannot specify that method is explicit without providing a function pointer to fe(t,y)."
                     );
      local_4 = -0x16;
    }
    else {
      *(undefined4 *)(in_stack_ffffffffffffffe0 + 3) = 1;
      *(undefined4 *)((long)in_stack_ffffffffffffffe0 + 0x1c) = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetExplicit(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetExplicit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* ensure that fe is defined */
  if (step_mem->fe == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetExplicit", MSG_ARK_MISSING_FE);
    return(ARK_ILL_INPUT);
  }

  /* set the relevant parameters */
  step_mem->explicit = SUNTRUE;
  step_mem->implicit = SUNFALSE;

  return(ARK_SUCCESS);
}